

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O1

int Cudd_ApaPrintDensity(FILE *fp,DdManager *dd,DdNode *node,int nvars)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  DdApaNumber __ptr;
  DdApaNumber number;
  long lVar4;
  ulong uVar5;
  long lVar6;
  double dVar7;
  int digits;
  int local_3c;
  double local_38;
  double local_30;
  
  __ptr = Cudd_ApaCountMinterm(dd,node,nvars,&local_3c);
  if (__ptr == (DdApaNumber)0x0) {
    iVar2 = 0;
  }
  else {
    uVar1 = Cudd_DagSize(node);
    lVar6 = (long)local_3c;
    number = (DdApaNumber)malloc(lVar6 * 4);
    local_30 = (double)uVar1;
    if (lVar6 < 1) {
      local_38 = 0.0;
    }
    else {
      lVar4 = 0;
      uVar5 = 0;
      do {
        dVar7 = (double)(uVar5 & 0xffffffff) * 4294967296.0 + (double)__ptr[lVar4];
        uVar5 = (ulong)(dVar7 / local_30);
        number[lVar4] = (DdApaDigit)uVar5;
        uVar5 = (ulong)(dVar7 - (double)(uVar5 & 0xffffffff) * local_30);
        lVar4 = lVar4 + 1;
      } while (lVar6 != lVar4);
      local_38 = (double)(uVar5 & 0xffffffff);
    }
    iVar2 = Cudd_ApaPrintDecimal(fp,local_3c,number);
    free(__ptr);
    if (number != (DdApaNumber)0x0) {
      free(number);
    }
    iVar3 = fprintf((FILE *)fp,".%u\n",(long)((local_38 / local_30) * 1000000.0));
    if (iVar3 == -1) {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
Cudd_ApaPrintDensity(
  FILE * fp,
  DdManager * dd,
  DdNode * node,
  int  nvars)
{
    int digits;
    int result;
    DdApaNumber count,density;
    unsigned int size, remainder, fractional;

    count = Cudd_ApaCountMinterm(dd,node,nvars,&digits);
    if (count == NULL)
        return(0);
    size = Cudd_DagSize(node);
    density = Cudd_NewApaNumber(digits);
    remainder = Cudd_ApaIntDivision(digits,count,size,density);
    result = Cudd_ApaPrintDecimal(fp,digits,density);
    ABC_FREE(count);
    ABC_FREE(density);
    fractional = (unsigned int)((double)remainder / size * 1000000);
    if (fprintf(fp,".%u\n", fractional) == EOF) {
        return(0);
    }
    return(result);

}